

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char_const(&)[4],char_const(&)[4]>
          (String *__return_storage_ptr__,kj *this,char (*params) [4],char (*params_1) [4])

{
  ArrayPtr<const_char> local_40;
  kj *local_30;
  size_t local_28;
  
  local_28 = strlen((char *)this);
  local_30 = this;
  local_40.size_ = strlen(*params);
  local_40.ptr = *params;
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,&local_40,(ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}